

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

bool __thiscall cmMessenger::GetDevWarningsAsErrors(cmMessenger *this)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  string local_38;
  
  this_00 = this->State;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_SUPPRESS_DEVELOPER_ERRORS","");
  val = cmState::GetCacheEntryValue(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (val == (char *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = cmSystemTools::IsOff(val);
  }
  return bVar1;
}

Assistant:

bool cmMessenger::GetDevWarningsAsErrors() const
{
  const char* cacheEntryValue =
    this->State->GetCacheEntryValue("CMAKE_SUPPRESS_DEVELOPER_ERRORS");
  return cacheEntryValue && cmSystemTools::IsOff(cacheEntryValue);
}